

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.cpp
# Opt level: O0

void baryonyx::context_set_parameters(context_ptr *ctx,string *name,string *value)

{
  bool bVar1;
  pointer pcVar2;
  type ctx_00;
  string *value_local;
  string *name_local;
  context_ptr *ctx_local;
  
  bVar1 = std::operator==(name,"method");
  if (bVar1) {
    pcVar2 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->(ctx);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pcVar2->method,value);
  }
  else {
    ctx_00 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*(ctx);
    warning<std::__cxx11::string>(ctx_00,"context: unknown variable {}.\n",name);
  }
  return;
}

Assistant:

void
context_set_parameters(const context_ptr& ctx,
                       const std::string& name,
                       std::string value)
{
    if (name == "method")
        ctx->method = std::move(value);
    else
        warning(*ctx, "context: unknown variable {}.\n", name);
}